

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

bool __thiscall cmComputeTargetDepends::Compute(cmComputeTargetDepends *this)

{
  bool bVar1;
  cmComputeComponentGraph ccg;
  string local_110;
  undefined1 local_f0 [216];
  
  CollectTargets(this);
  CollectDepends(this);
  if (this->DebugMode == true) {
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"initial","");
    DisplayGraph(this,&this->InitialGraph,(string *)local_f0);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
  }
  cmComputeComponentGraph::cmComputeComponentGraph
            ((cmComputeComponentGraph *)local_f0,&this->InitialGraph);
  if (this->DebugMode == true) {
    DisplayComponents(this,(cmComputeComponentGraph *)local_f0);
  }
  bVar1 = CheckComponents(this,(cmComputeComponentGraph *)local_f0);
  if (bVar1) {
    bVar1 = ComputeFinalDepends(this,(cmComputeComponentGraph *)local_f0);
    if (bVar1) {
      bVar1 = true;
      if (this->DebugMode == true) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"final","");
        DisplayGraph(this,&this->FinalGraph,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_00383fd1;
    }
  }
  bVar1 = false;
LAB_00383fd1:
  cmComputeComponentGraph::~cmComputeComponentGraph((cmComputeComponentGraph *)local_f0);
  return bVar1;
}

Assistant:

bool cmComputeTargetDepends::Compute()
{
  // Build the original graph.
  this->CollectTargets();
  this->CollectDepends();
  if (this->DebugMode) {
    this->DisplayGraph(this->InitialGraph, "initial");
  }

  // Identify components.
  cmComputeComponentGraph ccg(this->InitialGraph);
  if (this->DebugMode) {
    this->DisplayComponents(ccg);
  }
  if (!this->CheckComponents(ccg)) {
    return false;
  }

  // Compute the final dependency graph.
  if (!this->ComputeFinalDepends(ccg)) {
    return false;
  }
  if (this->DebugMode) {
    this->DisplayGraph(this->FinalGraph, "final");
  }

  return true;
}